

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  Member *members;
  
  is->src_ = is->src_ + 1;
  bVar2 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartObject(handler);
  if (bVar2) {
    SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
              (this,is);
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if (*is->src_ == '}') {
      is->src_ = is->src_ + 1;
      pcVar1 = (handler->stack_).stackTop_;
      pcVar1[-8] = '\0';
      pcVar1[-7] = '\0';
      pcVar1[-6] = '\0';
      pcVar1[-5] = '\0';
      pcVar1[-4] = '\0';
      pcVar1[-3] = '\0';
      pcVar1[-2] = '\x03';
      pcVar1[-1] = '\0';
      pcVar1[-0x10] = '\0';
      pcVar1[-0xf] = '\0';
      pcVar1[-0xe] = '\0';
      pcVar1[-0xd] = '\0';
      pcVar1[-0xc] = '\0';
      pcVar1[-0xb] = '\0';
      pcVar1[-10] = '\0';
      pcVar1[-9] = '\0';
      return;
    }
    uVar4 = 1;
    while( true ) {
      if (*is->src_ != '\"') {
        lVar3 = (long)is->src_ - (long)is->head_;
        *(undefined4 *)(this + 0x30) = 4;
        goto LAB_00139ee7;
      }
      ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,true);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                (this,is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      pcVar1 = is->src_;
      if (*pcVar1 != ':') {
        lVar3 = (long)pcVar1 - (long)is->head_;
        *(undefined4 *)(this + 0x30) = 5;
        goto LAB_00139ee7;
      }
      is->src_ = pcVar1 + 1;
      SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                (this,is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                (this,is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      pcVar1 = is->src_;
      if (*pcVar1 != ',') break;
      is->src_ = pcVar1 + 1;
      SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                (this,is);
      uVar4 = (ulong)((SizeType)uVar4 + 1);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
    }
    if (*pcVar1 == '}') {
      is->src_ = pcVar1 + 1;
      allocator = handler->allocator_;
      pcVar1 = (handler->stack_).stackTop_;
      members = (Member *)(pcVar1 + uVar4 * -0x20);
      (handler->stack_).stackTop_ = (char *)members;
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetObjectRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)(pcVar1 + uVar4 * -0x20 + -0x10),members,(SizeType)uVar4,allocator);
      return;
    }
    lVar3 = (long)pcVar1 - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 6;
  }
  else {
    lVar3 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
  }
LAB_00139ee7:
  *(long *)(this + 0x38) = lVar3;
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }